

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

void icetComposite(IceTImage destBuffer,IceTImage srcBuffer,int srcOnTop)

{
  IceTEnum IVar1;
  IceTEnum IVar2;
  IceTEnum IVar3;
  int iVar4;
  IceTFloat *pIVar5;
  IceTFloat *pIVar6;
  IceTUInt *pIVar7;
  IceTUInt *pIVar8;
  IceTFloat *pIVar9;
  IceTFloat *pIVar10;
  IceTUByte *pIVar11;
  IceTUByte *pIVar12;
  float fVar13;
  IceTFloat afactor_3;
  IceTFloat afactor_2;
  IceTFloat *destColorBuffer_3;
  IceTFloat *srcColorBuffer_3;
  IceTUInt afactor_1;
  IceTUInt afactor;
  IceTUByte *destColorBuffer_2;
  IceTUByte *srcColorBuffer_2;
  IceTFloat *destColorBuffer_1;
  IceTFloat *srcColorBuffer_1;
  IceTUInt *destColorBuffer;
  IceTUInt *srcColorBuffer;
  IceTFloat *destDepthBuffer;
  IceTFloat *srcDepthBuffer;
  IceTEnum depth_format;
  IceTEnum color_format;
  IceTEnum composite_mode;
  IceTSizeType i;
  IceTSizeType pixels;
  int srcOnTop_local;
  IceTImage srcBuffer_local;
  IceTImage destBuffer_local;
  
  i = srcOnTop;
  _pixels = srcBuffer.opaque_internals;
  srcBuffer_local = destBuffer;
  IVar1 = icetImageGetNumPixels(destBuffer);
  composite_mode = IVar1;
  IVar2 = icetImageGetNumPixels(_pixels);
  if (IVar1 == IVar2) {
    IVar1 = icetImageGetColorFormat(srcBuffer_local);
    IVar2 = icetImageGetDepthFormat(srcBuffer_local);
    IVar3 = icetImageGetColorFormat(_pixels);
    if ((IVar1 == IVar3) && (IVar3 = icetImageGetDepthFormat(_pixels), IVar2 == IVar3)) {
      icetGetEnumv(0x28,&depth_format);
      icetTimingBlendBegin();
      if (depth_format == 0x301) {
        if (IVar2 == 0xd001) {
          pIVar5 = icetImageGetDepthf(_pixels);
          pIVar6 = icetImageGetDepthf(srcBuffer_local);
          if (IVar1 == 0xc001) {
            pIVar7 = icetImageGetColorui(_pixels);
            pIVar8 = icetImageGetColorui(srcBuffer_local);
            for (color_format = 0; (int)color_format < (int)composite_mode;
                color_format = color_format + 1) {
              if ((float)pIVar5[(int)color_format] < (float)pIVar6[(int)color_format]) {
                pIVar6[(int)color_format] = pIVar5[(int)color_format];
                pIVar8[(int)color_format] = pIVar7[(int)color_format];
              }
            }
          }
          else if (IVar1 == 0xc002) {
            pIVar9 = icetImageGetColorf(_pixels);
            pIVar10 = icetImageGetColorf(srcBuffer_local);
            for (color_format = 0; (int)color_format < (int)composite_mode;
                color_format = color_format + 1) {
              if ((float)pIVar5[(int)color_format] < (float)pIVar6[(int)color_format]) {
                pIVar6[(int)color_format] = pIVar5[(int)color_format];
                pIVar10[(int)(color_format << 2)] = pIVar9[(int)(color_format << 2)];
                pIVar10[(int)(color_format * 4 + 1)] = pIVar9[(int)(color_format * 4 + 1)];
                pIVar10[(int)(color_format * 4 + 2)] = pIVar9[(int)(color_format * 4 + 2)];
                pIVar10[(int)(color_format * 4 + 3)] = pIVar9[(int)(color_format * 4 + 3)];
              }
            }
          }
          else if (IVar1 == 0xc000) {
            for (color_format = 0; (int)color_format < (int)composite_mode;
                color_format = color_format + 1) {
              if ((float)pIVar5[(int)color_format] < (float)pIVar6[(int)color_format]) {
                pIVar6[(int)color_format] = pIVar5[(int)color_format];
              }
            }
          }
          else {
            icetRaiseDiagnostic("Encountered invalid color format.",0xffffffff,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                                ,0x815);
          }
        }
        else if (IVar2 == 0xd000) {
          icetRaiseDiagnostic("Cannot use Z buffer compositing operation with no Z buffer.",
                              0xfffffffb,1,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                              ,0x819);
        }
        else {
          icetRaiseDiagnostic("Encountered invalid depth format.",0xffffffff,1,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                              ,0x81c);
        }
      }
      else if (depth_format == 0x302) {
        if (IVar2 != 0xd000) {
          icetRaiseDiagnostic("Z buffer ignored during blend composite operation.  Output z buffer meaningless."
                              ,0xfffffffa,3,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                              ,0x822);
        }
        if (IVar1 == 0xc001) {
          pIVar11 = icetImageGetColorcub(_pixels);
          pIVar12 = icetImageGetColorub(srcBuffer_local);
          if (i == 0) {
            for (color_format = 0; (int)color_format < (int)composite_mode;
                color_format = color_format + 1) {
              iVar4 = 0xff - (uint)pIVar12[(long)(int)(color_format << 2) + 3];
              pIVar12[(int)(color_format << 2)] =
                   (char)((ulong)((uint)pIVar11[(int)(color_format << 2)] * iVar4) / 0xff) +
                   pIVar12[(int)(color_format << 2)];
              pIVar12[(long)(int)(color_format << 2) + 1] =
                   (char)((ulong)((uint)pIVar11[(long)(int)(color_format << 2) + 1] * iVar4) / 0xff)
                   + pIVar12[(long)(int)(color_format << 2) + 1];
              pIVar12[(long)(int)(color_format << 2) + 2] =
                   (char)((ulong)((uint)pIVar11[(long)(int)(color_format << 2) + 2] * iVar4) / 0xff)
                   + pIVar12[(long)(int)(color_format << 2) + 2];
              pIVar12[(long)(int)(color_format << 2) + 3] =
                   (char)((ulong)((uint)pIVar11[(long)(int)(color_format << 2) + 3] * iVar4) / 0xff)
                   + pIVar12[(long)(int)(color_format << 2) + 3];
            }
          }
          else {
            for (color_format = 0; (int)color_format < (int)composite_mode;
                color_format = color_format + 1) {
              iVar4 = 0xff - (uint)pIVar11[(long)(int)(color_format << 2) + 3];
              pIVar12[(int)(color_format << 2)] =
                   (char)((ulong)((uint)pIVar12[(int)(color_format << 2)] * iVar4) / 0xff) +
                   pIVar11[(int)(color_format << 2)];
              pIVar12[(long)(int)(color_format << 2) + 1] =
                   (char)((ulong)((uint)pIVar12[(long)(int)(color_format << 2) + 1] * iVar4) / 0xff)
                   + pIVar11[(long)(int)(color_format << 2) + 1];
              pIVar12[(long)(int)(color_format << 2) + 2] =
                   (char)((ulong)((uint)pIVar12[(long)(int)(color_format << 2) + 2] * iVar4) / 0xff)
                   + pIVar11[(long)(int)(color_format << 2) + 2];
              pIVar12[(long)(int)(color_format << 2) + 3] =
                   (char)((ulong)((uint)pIVar12[(long)(int)(color_format << 2) + 3] * iVar4) / 0xff)
                   + pIVar11[(long)(int)(color_format << 2) + 3];
            }
          }
        }
        else if (IVar1 == 0xc002) {
          pIVar5 = icetImageGetColorcf(_pixels);
          pIVar6 = icetImageGetColorf(srcBuffer_local);
          if (i == 0) {
            for (color_format = 0; (int)color_format < (int)composite_mode;
                color_format = color_format + 1) {
              fVar13 = 1.0 - (float)pIVar6[(long)(int)(color_format << 2) + 3];
              pIVar6[(int)(color_format << 2)] =
                   (IceTFloat)
                   ((float)pIVar5[(int)(color_format << 2)] * fVar13 +
                   (float)pIVar6[(int)(color_format << 2)]);
              pIVar6[(long)(int)(color_format << 2) + 1] =
                   (IceTFloat)
                   ((float)pIVar5[(long)(int)(color_format << 2) + 1] * fVar13 +
                   (float)pIVar6[(long)(int)(color_format << 2) + 1]);
              pIVar6[(long)(int)(color_format << 2) + 2] =
                   (IceTFloat)
                   ((float)pIVar5[(long)(int)(color_format << 2) + 2] * fVar13 +
                   (float)pIVar6[(long)(int)(color_format << 2) + 2]);
              pIVar6[(long)(int)(color_format << 2) + 3] =
                   (IceTFloat)
                   ((float)pIVar5[(long)(int)(color_format << 2) + 3] * fVar13 +
                   (float)pIVar6[(long)(int)(color_format << 2) + 3]);
            }
          }
          else {
            for (color_format = 0; (int)color_format < (int)composite_mode;
                color_format = color_format + 1) {
              fVar13 = 1.0 - (float)pIVar5[(long)(int)(color_format << 2) + 3];
              pIVar6[(int)(color_format << 2)] =
                   (IceTFloat)
                   ((float)pIVar6[(int)(color_format << 2)] * fVar13 +
                   (float)pIVar5[(int)(color_format << 2)]);
              pIVar6[(long)(int)(color_format << 2) + 1] =
                   (IceTFloat)
                   ((float)pIVar6[(long)(int)(color_format << 2) + 1] * fVar13 +
                   (float)pIVar5[(long)(int)(color_format << 2) + 1]);
              pIVar6[(long)(int)(color_format << 2) + 2] =
                   (IceTFloat)
                   ((float)pIVar6[(long)(int)(color_format << 2) + 2] * fVar13 +
                   (float)pIVar5[(long)(int)(color_format << 2) + 2]);
              pIVar6[(long)(int)(color_format << 2) + 3] =
                   (IceTFloat)
                   ((float)pIVar6[(long)(int)(color_format << 2) + 3] * fVar13 +
                   (float)pIVar5[(long)(int)(color_format << 2) + 3]);
            }
          }
        }
        else if (IVar1 == 0xc000) {
          icetRaiseDiagnostic("Compositing image with no data.",0xfffffffb,3,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                              ,0x842);
        }
        else {
          icetRaiseDiagnostic("Encountered invalid color format.",0xffffffff,1,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                              ,0x845);
        }
      }
      else {
        icetRaiseDiagnostic("Encountered invalid composite mode.",0xffffffff,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                            ,0x849);
      }
      icetTimingBlendEnd();
    }
    else {
      icetRaiseDiagnostic("Source and destination types don\'t match.",0xffffffff,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                          ,0x7eb);
    }
  }
  else {
    icetRaiseDiagnostic("Source and destination sizes don\'t match.",0xffffffff,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                        ,0x7e1);
  }
  return;
}

Assistant:

void icetComposite(IceTImage destBuffer, const IceTImage srcBuffer,
                   int srcOnTop)
{
    IceTSizeType pixels;
    IceTSizeType i;
    IceTEnum composite_mode;
    IceTEnum color_format, depth_format;

    pixels = icetImageGetNumPixels(destBuffer);
    if (pixels != icetImageGetNumPixels(srcBuffer)) {
        icetRaiseError("Source and destination sizes don't match.",
                       ICET_SANITY_CHECK_FAIL);
        return;
    }

    color_format = icetImageGetColorFormat(destBuffer);
    depth_format = icetImageGetDepthFormat(destBuffer);

    if (   (color_format != icetImageGetColorFormat(srcBuffer))
        || (depth_format != icetImageGetDepthFormat(srcBuffer)) ) {
        icetRaiseError("Source and destination types don't match.",
                       ICET_SANITY_CHECK_FAIL);
        return;
    }

    icetGetEnumv(ICET_COMPOSITE_MODE, &composite_mode);

    icetTimingBlendBegin();

    if (composite_mode == ICET_COMPOSITE_MODE_Z_BUFFER) {
        if (depth_format == ICET_IMAGE_DEPTH_FLOAT) {
            const IceTFloat *srcDepthBuffer = icetImageGetDepthf(srcBuffer);
            IceTFloat *destDepthBuffer = icetImageGetDepthf(destBuffer);

            if (color_format == ICET_IMAGE_COLOR_RGBA_UBYTE) {
                const IceTUInt *srcColorBuffer=icetImageGetColorui(srcBuffer);
                IceTUInt *destColorBuffer = icetImageGetColorui(destBuffer);
                for (i = 0; i < pixels; i++) {
                    if (srcDepthBuffer[i] < destDepthBuffer[i]) {
                        destDepthBuffer[i] = srcDepthBuffer[i];
                        destColorBuffer[i] = srcColorBuffer[i];
                    }
                }
            } else if (color_format == ICET_IMAGE_COLOR_RGBA_FLOAT) {
                const IceTFloat *srcColorBuffer = icetImageGetColorf(srcBuffer);
                IceTFloat *destColorBuffer = icetImageGetColorf(destBuffer);
                for (i = 0; i < pixels; i++) {
                    if (srcDepthBuffer[i] < destDepthBuffer[i]) {
                        destDepthBuffer[i] = srcDepthBuffer[i];
                        destColorBuffer[4*i+0] = srcColorBuffer[4*i+0];
                        destColorBuffer[4*i+1] = srcColorBuffer[4*i+1];
                        destColorBuffer[4*i+2] = srcColorBuffer[4*i+2];
                        destColorBuffer[4*i+3] = srcColorBuffer[4*i+3];
                    }
                }
            } else if (color_format == ICET_IMAGE_COLOR_NONE) {
                for (i = 0; i < pixels; i++) {
                    if (srcDepthBuffer[i] < destDepthBuffer[i]) {
                        destDepthBuffer[i] = srcDepthBuffer[i];
                    }
                }
            } else {
                icetRaiseError("Encountered invalid color format.",
                               ICET_SANITY_CHECK_FAIL);
            }
        } else if (depth_format == ICET_IMAGE_DEPTH_NONE) {
            icetRaiseError("Cannot use Z buffer compositing operation with no"
                           " Z buffer.", ICET_INVALID_OPERATION);
        } else {
            icetRaiseError("Encountered invalid depth format.",
                           ICET_SANITY_CHECK_FAIL);
        }
    } else if (composite_mode == ICET_COMPOSITE_MODE_BLEND) {
        if (depth_format != ICET_IMAGE_DEPTH_NONE) {
            icetRaiseWarning("Z buffer ignored during blend composite"
                             " operation.  Output z buffer meaningless.",
                             ICET_INVALID_VALUE);
        }
        if (color_format == ICET_IMAGE_COLOR_RGBA_UBYTE) {
            const IceTUByte *srcColorBuffer = icetImageGetColorcub(srcBuffer);
            IceTUByte *destColorBuffer = icetImageGetColorub(destBuffer);
            if (srcOnTop) {
                for (i = 0; i < pixels; i++) {
                    ICET_OVER_UBYTE(srcColorBuffer + i*4,
                                    destColorBuffer + i*4);
                }
            } else {
                for (i = 0; i < pixels; i++) {
                    ICET_UNDER_UBYTE(srcColorBuffer + i*4,
                                     destColorBuffer + i*4);
                }
            }
        } else if (color_format == ICET_IMAGE_COLOR_RGBA_FLOAT) {
            const IceTFloat *srcColorBuffer = icetImageGetColorcf(srcBuffer);
            IceTFloat *destColorBuffer = icetImageGetColorf(destBuffer);
            if (srcOnTop) {
                for (i = 0; i < pixels; i++) {
                    ICET_OVER_FLOAT(srcColorBuffer + i*4,
                                    destColorBuffer + i*4);
                }
            } else {
                for (i = 0; i < pixels; i++) {
                    ICET_UNDER_FLOAT(srcColorBuffer + i*4,
                                     destColorBuffer + i*4);
                }
            }
        } else if (color_format == ICET_IMAGE_COLOR_NONE) {
            icetRaiseWarning("Compositing image with no data.",
                             ICET_INVALID_OPERATION);
        } else {
            icetRaiseError("Encountered invalid color format.",
                           ICET_SANITY_CHECK_FAIL);
        }
    } else {
        icetRaiseError("Encountered invalid composite mode.",
                       ICET_SANITY_CHECK_FAIL);
    }

    icetTimingBlendEnd();
}